

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O1

void __thiscall Hpipe::anon_unknown_7::PcMaker::~PcMaker(PcMaker *this)

{
  pointer puVar1;
  void *pvVar2;
  
  puVar1 = (this->res).second.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->res).second.
                                 super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>_>
  ::~_Rb_tree(&(this->res).first.paths_to_strings._M_t);
  puVar1 = (this->res).first.paths_to_mark.super_vector<unsigned_int,_std::allocator<unsigned_int>_>
           .super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)*(pointer *)
                                  ((long)&(this->res).first.paths_to_mark.
                                          super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data + 0x10) - (long)puVar1);
  }
  pvVar2 = (this->res).first.pos.
           super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
           super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)*(pointer *)
                                  ((long)&(this->res).first.pos.
                                          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                          .
                                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                          ._M_impl.super__Vector_impl_data + 0x10) - (long)pvVar2);
    return;
  }
  return;
}

Assistant:

PcMaker( const Context *orig ) : res{ orig->flags, {} }, orig{ orig } {
        res.first.mark = orig->mark;
    }